

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void cpp_db::bind_params(statement *stmt,initializer_list<cpp_db::parameter> params)

{
  parameter *this;
  socklen_t in_ECX;
  sockaddr *__addr;
  parameter *ppVar1;
  long lVar2;
  parameters p;
  parameter param;
  undefined1 local_60 [64];
  
  ppVar1 = params._M_array;
  (*((stmt->stmt_impl).super___shared_ptr<cpp_db::statement_interface,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_statement_interface[7])();
  statement::get_parameters((statement *)local_60);
  this = (parameter *)(local_60 + 8);
  for (lVar2 = params._M_len * 0x38; lVar2 != 0; lVar2 = lVar2 + -0x38) {
    parameter::parameter(this,ppVar1);
    parameters::bind((parameters *)local_60,(int)this,__addr,in_ECX);
    parameter::~parameter(this);
    ppVar1 = ppVar1 + 1;
  }
  parameters::~parameters((parameters *)local_60);
  return;
}

Assistant:

static void bind_params(statement &stmt, std::initializer_list<parameter> params)
{
	stmt.reset();
	parameters p(stmt.get_parameters());

	for (auto param : params)
		p.bind(param);
}